

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

UBool do_canonicalize(char *localeID,char *buffer,int32_t bufferCapacity,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  int32_t bufferCapacity_local;
  char *buffer_local;
  char *localeID_local;
  
  uloc_canonicalize_63(localeID,buffer,bufferCapacity,err);
  if ((*err == U_STRING_NOT_TERMINATED_WARNING) || (*err == U_BUFFER_OVERFLOW_ERROR)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    localeID_local._7_1_ = '\0';
  }
  else {
    UVar1 = U_FAILURE(*err);
    if (UVar1 == '\0') {
      localeID_local._7_1_ = '\x01';
    }
    else {
      localeID_local._7_1_ = '\0';
    }
  }
  return localeID_local._7_1_;
}

Assistant:

static UBool
do_canonicalize(const char*    localeID,
         char* buffer,
         int32_t bufferCapacity,
         UErrorCode* err)
{
    uloc_canonicalize(
        localeID,
        buffer,
        bufferCapacity,
        err);

    if (*err == U_STRING_NOT_TERMINATED_WARNING ||
        *err == U_BUFFER_OVERFLOW_ERROR) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;

        return FALSE;
    }
    else if (U_FAILURE(*err)) {

        return FALSE;
    }
    else {
        return TRUE;
    }
}